

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O0

void Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::SetAuxPtr
               (FunctionProxy *host,AuxPointerType e,void *ptr)

{
  code *pcVar1;
  bool bVar2;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> **ppAVar3;
  undefined4 *puVar4;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *pAVar5;
  bool ret;
  bool ret_3;
  bool ret_2;
  bool ret_1;
  void *ptr_local;
  AuxPointerType e_local;
  FunctionProxy *host_local;
  
  ppAVar3 = Memory::WriteBarrierPtr::operator_cast_to_AuxPtrs__((WriteBarrierPtr *)&host->auxPtrs);
  if (*ppAVar3 == (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0) {
    AllocAuxPtrFix(host,'\x10');
    ppAVar3 = Memory::WriteBarrierPtr::operator_cast_to_AuxPtrs__((WriteBarrierPtr *)&host->auxPtrs)
    ;
    bVar2 = AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'\x10',_(unsigned_char)'\x01'>
            ::Set((AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
                   *)*ppAVar3,e,ptr);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
                                  ,0xe6,"(ret)","ret");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  else {
    pAVar5 = Memory::
             WriteBarrierPtr<Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>_>::
             operator->(&host->auxPtrs);
    if (pAVar5->count == '\x01') {
      ppAVar3 = Memory::WriteBarrierPtr::operator_cast_to_AuxPtrs__
                          ((WriteBarrierPtr *)&host->auxPtrs);
      bVar2 = AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'\x10',_(unsigned_char)'\x01'>
              ::Set((AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
                     *)*ppAVar3,e,ptr);
      if (bVar2) {
        return;
      }
      AllocAuxPtrFix(host,' ');
    }
    pAVar5 = Memory::
             WriteBarrierPtr<Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>_>::
             operator->(&host->auxPtrs);
    if (pAVar5->count == '\x03') {
      ppAVar3 = Memory::WriteBarrierPtr::operator_cast_to_AuxPtrs__
                          ((WriteBarrierPtr *)&host->auxPtrs);
      bVar2 = AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'_',_(unsigned_char)'\x03'>
              ::Set((AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)___,_(unsigned_char)__x03_>
                     *)*ppAVar3,e,ptr);
      if (bVar2) {
        return;
      }
      AllocAuxPtr(host,'\x04');
    }
    pAVar5 = Memory::
             WriteBarrierPtr<Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>_>::
             operator->(&host->auxPtrs);
    bVar2 = Set(pAVar5,e,ptr);
    if (!bVar2) {
      pAVar5 = Memory::
               WriteBarrierPtr<Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>_>::
               operator->(&host->auxPtrs);
      AllocAuxPtr(host,pAVar5->count + '\x01');
      pAVar5 = Memory::
               WriteBarrierPtr<Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>_>::
               operator->(&host->auxPtrs);
      bVar2 = Set(pAVar5,e,ptr);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
                                    ,0x107,"(ret)","ret");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
  }
  return;
}

Assistant:

void AuxPtrs<T, FieldsEnum>::SetAuxPtr(T* host, FieldsEnum e, void* ptr)
    {

        if (host->auxPtrs == nullptr)
        {
            AuxPtrs<FunctionProxy, FieldsEnum>::AllocAuxPtrFix(host, 16);
            bool ret = ((AuxPtrs16*)(void*)host->auxPtrs)->Set(e, ptr);
            Assert(ret);
            return;
        }
        if (host->auxPtrs->count == AuxPtrs16::MaxCount)
        {
            bool ret = ((AuxPtrs16*)(void*)host->auxPtrs)->Set(e, ptr);
            if (ret)
            {
                return;
            }
            else
            {
                AuxPtrs<FunctionProxy, FieldsEnum>::AllocAuxPtrFix(host, 32);
            }
        }
        if (host->auxPtrs->count == AuxPtrs32::MaxCount)
        {
            bool ret = ((AuxPtrs32*)(void*)host->auxPtrs)->Set(e, ptr);
            if (ret)
            {
                return;
            }
            else
            {
                AuxPtrs<FunctionProxy, FieldsEnum>::AllocAuxPtr(host, AuxPtrs32::MaxCount + 1);
            }
        }

        bool ret = host->auxPtrs->Set(e, ptr);
        if (!ret)
        {
            AuxPtrs<FunctionProxy, FieldsEnum>::AllocAuxPtr(host, host->auxPtrs->count + 1);
            ret = host->auxPtrs->Set(e, ptr);
            Assert(ret);
        }
    }